

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.h
# Opt level: O0

cmCommand * __thiscall
cmTargetIncludeDirectoriesCommand::Clone(cmTargetIncludeDirectoriesCommand *this)

{
  cmCommand *this_00;
  cmTargetIncludeDirectoriesCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x78);
  cmTargetIncludeDirectoriesCommand((cmTargetIncludeDirectoriesCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmTargetIncludeDirectoriesCommand;
    }